

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O2

void __thiscall
Catch::Generators::Generators<fd::AccuracyOrder>::add_generator
          (Generators<fd::AccuracyOrder> *this,AccuracyOrder *val)

{
  long *local_20;
  
  value<fd::AccuracyOrder,fd::AccuracyOrder>((Generators *)&local_20,val);
  std::
  vector<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>>
            ((vector<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>>>
              *)&this->m_generators,(GeneratorWrapper<fd::AccuracyOrder> *)&local_20);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 0x18))();
  }
  return;
}

Assistant:

void add_generator( T&& val ) {
            m_generators.emplace_back( value( CATCH_MOVE( val ) ) );
        }